

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall luna::CodeGenerateVisitor::DeleteCurrentFunction(CodeGenerateVisitor *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long in_RDI;
  GenerateBlock *block;
  GenerateFunction *function;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x10);
  while (puVar1[1] != 0) {
    puVar2 = (undefined8 *)puVar1[1];
    puVar1[1] = *puVar2;
    if (puVar2 != (undefined8 *)0x0) {
      GenerateBlock::~GenerateBlock((GenerateBlock *)0x1b72f1);
      operator_delete(puVar2);
    }
  }
  *(undefined8 *)(in_RDI + 0x10) = *puVar1;
  if (puVar1 != (undefined8 *)0x0) {
    GenerateFunction::~GenerateFunction((GenerateFunction *)0x1b7328);
    operator_delete(puVar1);
  }
  return;
}

Assistant:

void DeleteCurrentFunction()
        {
            auto function = current_function_;

            // Delete all blocks in function
            while (function->current_block_)
            {
                auto block = function->current_block_;
                function->current_block_ = block->parent_;
                delete block;
            }

            current_function_ = function->parent_;
            delete function;
        }